

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

void archive_entry_linkresolver_free(archive_entry_linkresolver *res)

{
  links_entry_conflict *plVar1;
  links_entry_conflict *le;
  archive_entry_linkresolver *res_local;
  
  if (res != (archive_entry_linkresolver *)0x0) {
    while (plVar1 = next_entry(res,3), plVar1 != (links_entry_conflict *)0x0) {
      archive_entry_free(plVar1->entry);
    }
    free(res->buckets);
    free(res);
  }
  return;
}

Assistant:

void
archive_entry_linkresolver_free(struct archive_entry_linkresolver *res)
{
	struct links_entry *le;

	if (res == NULL)
		return;

	while ((le = next_entry(res, NEXT_ENTRY_ALL)) != NULL)
		archive_entry_free(le->entry);
	free(res->buckets);
	free(res);
}